

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkDuplicateIfConditions(CheckerVisitor *this,IfStatement *ifStmt)

{
  bool bVar1;
  TreeOp TVar2;
  Node *this_00;
  IfStatement *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *unaff_retaddr;
  Expr *duplicated;
  Statement *elseB;
  Statement *in_stack_ffffffffffffffe8;
  CheckerVisitor *elseNode;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    elseNode = in_RDI;
    IfStatement::elseBranch(in_RSI);
    this_00 = &unwrapSingleBlock(in_stack_ffffffffffffffe8)->super_Node;
    if ((this_00 != (Node *)0x0) && (TVar2 = Node::op(this_00), TVar2 == TO_IF)) {
      IfStatement::condition(in_RSI);
      bVar1 = findIfWithTheSameCondition
                        ((CheckerVisitor *)duplicated,unaff_retaddr,(IfStatement *)elseNode,
                         (Expr **)in_RSI);
      if (bVar1) {
        report(in_RDI,(Node *)0x0,0x43);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkDuplicateIfConditions(IfStatement *ifStmt) {

  if (effectsOnly)
    return;

  const Statement *elseB = unwrapSingleBlock(ifStmt->elseBranch());
  const Expr *duplicated = nullptr;

  if (elseB && elseB->op() == TO_IF) {
    if (findIfWithTheSameCondition(ifStmt->condition(), static_cast<const IfStatement *>(elseB), duplicated)) {
      // TODO: high-light both conditions, original and duplicated
      report(duplicated, DiagnosticsId::DI_DUPLICATE_IF_EXPR);
    }
  }
}